

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O1

UBool __thiscall icu_63::RegexMatcher::isUWordBoundary(RegexMatcher *this,int64_t pos)

{
  UBool UVar1;
  uint uVar2;
  Locale *key;
  RuleBasedBreakIterator *pRVar4;
  UErrorCode status;
  UErrorCode local_1c;
  int iVar3;
  
  if (this->fWordBreakItr == (RuleBasedBreakIterator *)0x0) {
    key = Locale::getEnglish();
    pRVar4 = (RuleBasedBreakIterator *)BreakIterator::createWordInstance(key,&this->fDeferredStatus)
    ;
    this->fWordBreakItr = pRVar4;
    if (U_ZERO_ERROR < this->fDeferredStatus) {
      return '\0';
    }
    (*(pRVar4->super_BreakIterator).super_UObject._vptr_UObject[8])
              (pRVar4,this->fInputText,&this->fDeferredStatus);
  }
  if (pos < this->fLookLimit) {
    if (this->fInputText->pFuncs->mapNativeIndexToUTF16 != (UTextMapNativeIndexToUTF16 *)0x0) {
      local_1c = U_ZERO_ERROR;
      uVar2 = utext_extract_63(this->fInputText,0,pos,(UChar *)0x0,0,&local_1c);
      pos = (int64_t)uVar2;
    }
    iVar3 = (*(this->fWordBreakItr->super_BreakIterator).super_UObject._vptr_UObject[0x11])
                      (this->fWordBreakItr,pos & 0xffffffff);
    UVar1 = (UBool)iVar3;
  }
  else {
    this->fHitEnd = '\x01';
    UVar1 = '\x01';
  }
  return UVar1;
}

Assistant:

UBool RegexMatcher::isUWordBoundary(int64_t pos) {
    UBool       returnVal = FALSE;
#if UCONFIG_NO_BREAK_ITERATION==0

    // If we haven't yet created a break iterator for this matcher, do it now.
    if (fWordBreakItr == NULL) {
        fWordBreakItr =
            (RuleBasedBreakIterator *)BreakIterator::createWordInstance(Locale::getEnglish(), fDeferredStatus);
        if (U_FAILURE(fDeferredStatus)) {
            return FALSE;
        }
        fWordBreakItr->setText(fInputText, fDeferredStatus);
    }

    if (pos >= fLookLimit) {
        fHitEnd = TRUE;
        returnVal = TRUE;   // With Unicode word rules, only positions within the interior of "real"
                            //    words are not boundaries.  All non-word chars stand by themselves,
                            //    with word boundaries on both sides.
    } else {
        if (!UTEXT_USES_U16(fInputText)) {
            // !!!: Would like a better way to do this!
            UErrorCode status = U_ZERO_ERROR;
            pos = utext_extract(fInputText, 0, pos, NULL, 0, &status);
        }
        returnVal = fWordBreakItr->isBoundary((int32_t)pos);
    }
#endif
    return   returnVal;
}